

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O1

Vec_Wec_t * Gia_ManCreateSupps(Gia_Man_t *p,int fVerbose)

{
  int *piVar1;
  undefined8 uVar2;
  int *piVar3;
  int iVar4;
  Vec_Wec_t *pVVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  int iVar9;
  uint uVar10;
  int *piVar11;
  long lVar12;
  int *piVar13;
  uint uVar14;
  size_t __size;
  int *piVar15;
  long lVar16;
  timespec ts;
  long local_58;
  timespec local_48;
  Vec_Wec_t *local_38;
  
  iVar4 = clock_gettime(3,&local_48);
  if (iVar4 < 0) {
    local_58 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    local_58 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  iVar4 = p->nObjs;
  pVVar5 = (Vec_Wec_t *)malloc(0x10);
  iVar9 = 8;
  if (6 < iVar4 - 1U) {
    iVar9 = iVar4;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar9;
  if (iVar9 == 0) {
    pVVar6 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar6 = (Vec_Int_t *)calloc((long)iVar9,0x10);
  }
  pVVar5->pArray = pVVar6;
  pVVar5->nSize = iVar4;
  pVVar7 = p->vCis;
  if (0 < pVVar7->nSize) {
    lVar12 = 0;
    do {
      iVar9 = pVVar7->pArray[lVar12];
      if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iVar9 == 0) break;
      if (iVar4 <= iVar9) goto LAB_0059709b;
      Vec_IntPush(pVVar6 + iVar9,(int)lVar12);
      lVar12 = lVar12 + 1;
      pVVar7 = p->vCis;
    } while (lVar12 < pVVar7->nSize);
  }
  if (0 < p->nObjs) {
    lVar12 = 0;
    local_38 = pVVar5;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar2 = *(undefined8 *)(p->pObjs + lVar12);
      uVar10 = (uint)uVar2;
      if ((~uVar10 & 0x1fffffff) != 0 && -1 < (int)uVar10) {
        uVar10 = (int)lVar12 - (uVar10 & 0x1fffffff);
        if ((int)uVar10 < 0) {
LAB_0059709b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                        ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        iVar4 = pVVar5->nSize;
        if ((((iVar4 <= (int)uVar10) ||
             (uVar14 = (int)lVar12 - ((uint)((ulong)uVar2 >> 0x20) & 0x1fffffff), (int)uVar14 < 0))
            || (iVar4 <= (int)uVar14)) || (iVar4 <= lVar12)) goto LAB_0059709b;
        pVVar7 = pVVar5->pArray;
        pVVar6 = pVVar7 + lVar12;
        lVar16 = (long)pVVar7[uVar14].nSize + (long)pVVar7[uVar10].nSize;
        iVar4 = (int)lVar16;
        if (pVVar7[lVar12].nCap < iVar4) {
          __size = lVar16 * 4;
          if (pVVar6->pArray == (int *)0x0) {
            piVar8 = (int *)malloc(__size);
          }
          else {
            piVar8 = (int *)realloc(pVVar6->pArray,__size);
          }
          pVVar6->pArray = piVar8;
          if (piVar8 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar6->nCap = iVar4;
        }
        piVar3 = pVVar6->pArray;
        piVar15 = pVVar7[uVar10].pArray;
        piVar11 = pVVar7[uVar14].pArray;
        piVar8 = piVar15 + pVVar7[uVar10].nSize;
        piVar1 = piVar11 + pVVar7[uVar14].nSize;
        piVar13 = piVar3;
        if ((0 < (long)pVVar7[uVar10].nSize) && (0 < pVVar7[uVar14].nSize)) {
          do {
            iVar4 = *piVar15;
            iVar9 = *piVar11;
            if (iVar4 == iVar9) {
              piVar15 = piVar15 + 1;
              *piVar13 = iVar4;
              piVar11 = piVar11 + 1;
            }
            else if (iVar4 < iVar9) {
              piVar15 = piVar15 + 1;
              *piVar13 = iVar4;
            }
            else {
              piVar11 = piVar11 + 1;
              *piVar13 = iVar9;
            }
            piVar13 = piVar13 + 1;
          } while ((piVar15 < piVar8) && (piVar11 < piVar1));
        }
        for (; piVar15 < piVar8; piVar15 = piVar15 + 1) {
          *piVar13 = *piVar15;
          piVar13 = piVar13 + 1;
        }
        for (; piVar11 < piVar1; piVar11 = piVar11 + 1) {
          *piVar13 = *piVar11;
          piVar13 = piVar13 + 1;
        }
        iVar4 = (int)((ulong)((long)piVar13 - (long)piVar3) >> 2);
        pVVar6->nSize = iVar4;
        if (pVVar6->nCap < iVar4) {
          __assert_fail("vArr->nSize <= vArr->nCap",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x707,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        if (iVar4 < pVVar7[uVar10].nSize) {
          __assert_fail("vArr->nSize >= vArr1->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x708,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        pVVar5 = local_38;
        if (iVar4 < pVVar7[uVar14].nSize) {
          __assert_fail("vArr->nSize >= vArr2->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x709,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < p->nObjs);
  }
  if (fVerbose != 0) {
    iVar9 = 3;
    iVar4 = clock_gettime(3,&local_48);
    if (iVar4 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    Abc_Print(iVar9,"%s =","Support computation");
    Abc_Print(iVar9,"%9.2f sec\n",(double)(lVar12 + local_58) / 1000000.0);
  }
  return pVVar5;
}

Assistant:

Vec_Wec_t * Gia_ManCreateSupps( Gia_Man_t * p, int fVerbose )
{
    abctime clk = Abc_Clock();
    Gia_Obj_t * pObj; int i, Id;
    Vec_Wec_t * vSupps = Vec_WecStart( Gia_ManObjNum(p) );
    Gia_ManForEachCiId( p, Id, i )
        Vec_IntPush( Vec_WecEntry(vSupps, Id), i );
    Gia_ManForEachAnd( p, pObj, Id )
        Vec_IntTwoMerge2( Vec_WecEntry(vSupps, Gia_ObjFaninId0(pObj, Id)), 
                          Vec_WecEntry(vSupps, Gia_ObjFaninId1(pObj, Id)), 
                          Vec_WecEntry(vSupps, Id) ); 
//    Gia_ManForEachCo( p, pObj, i )
//        Vec_IntAppend( Vec_WecEntry(vSupps, Gia_ObjId(p, pObj)), Vec_WecEntry(vSupps, Gia_ObjFaninId0p(p, pObj)) );
    if ( fVerbose )
        Abc_PrintTime( 1, "Support computation", Abc_Clock() - clk );
    return vSupps;
}